

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.hpp
# Opt level: O0

SmallIntegerValue Lodtalk::divideRoundNeg(SmallIntegerValue dividend,SmallIntegerValue divisor)

{
  SmallIntegerValue positiveDividend;
  SmallIntegerValue positiveDivisor;
  SmallIntegerValue divisor_local;
  SmallIntegerValue dividend_local;
  
  if (divisor != 0) {
    if (dividend < 0) {
      if (divisor < 1) {
        dividend_local = dividend / divisor;
      }
      else {
        dividend_local = -((divisor - dividend) + -1) / divisor;
      }
    }
    else if (divisor < 1) {
      dividend_local = -((dividend - divisor) + -1) / divisor;
    }
    else {
      dividend_local = dividend / divisor;
    }
    return dividend_local;
  }
  __assert_fail("divisor != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/Math.hpp"
                ,0xc,
                "SmallIntegerValue Lodtalk::divideRoundNeg(SmallIntegerValue, SmallIntegerValue)");
}

Assistant:

inline SmallIntegerValue divideRoundNeg(SmallIntegerValue dividend, SmallIntegerValue divisor)
{
    // This algorithm was taken from the Squeak VM.
    assert(divisor != 0);
    if (dividend >= 0)
    {
        if (divisor > 0)
        {
            // Positive result.
            return dividend / divisor;
        }
        else
        {
            // Negative result. Round towards minus infinite.
            auto positiveDivisor = -divisor;
            return  -(dividend + positiveDivisor - 1) / divisor;
        }
    }
    else
    {
        auto positiveDividend = -dividend;
        if (divisor > 0)
        {
            // Negative result. Round towards minus infinite.
            return  -(positiveDividend + divisor - 1) / divisor;
        }
        else
        {
            // Positive result.
            return dividend / divisor;
        }
    }
}